

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * __thiscall IR::Instr::Copy(Instr *this,bool copyDst)

{
  OpCode opcode;
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  BailOutKind BVar4;
  uint32 uVar5;
  BailOutInfo *bailOutInfo;
  ProfiledInstr *this_00;
  JitProfilingInstr *this_01;
  PragmaInstr *this_02;
  undefined4 *puVar6;
  Opnd *pOVar7;
  Opnd *opnd;
  Instr *instrCopy;
  bool copyDst_local;
  Instr *this_local;
  
  bVar2 = HasBailOutInfo(this);
  if ((bVar2) || (bVar2 = HasAuxBailOut(this), bVar2)) {
    opcode = this->m_opcode;
    BVar4 = GetBailOutKind(this);
    bailOutInfo = GetBailOutInfo(this);
    opnd = (Opnd *)BailOutInstrTemplate<IR::Instr>::New(opcode,BVar4,bailOutInfo,this->m_func);
    uVar5 = GetByteCodeOffset(this);
    SetByteCodeOffset((Instr *)opnd,uVar5);
    bVar2 = HasAuxBailOut(this);
    if (bVar2) {
      (((BailOutInstrTemplate<IR::Instr> *)opnd)->super_Instr).field_0x38 =
           (((BailOutInstrTemplate<IR::Instr> *)opnd)->super_Instr).field_0x38 & 0xbf | 0x40;
      BVar4 = GetAuxBailOutKind(this);
      SetAuxBailOutKind((Instr *)opnd,BVar4);
    }
  }
  else {
    IVar3 = GetKind(this);
    switch(IVar3) {
    case InstrKindInstr:
      opnd = (Opnd *)New(this->m_opcode,this->m_func);
      break;
    default:
      opnd = (Opnd *)0x0;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x1ef,"((0))","Copy of other instr kinds NYI");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      break;
    case InstrKindProfiled:
      this_00 = AsProfiledInstr(this);
      opnd = (Opnd *)ProfiledInstr::CopyProfiledInstr(this_00);
      break;
    case InstrKindPragma:
      this_02 = AsPragmaInstr(this);
      opnd = (Opnd *)PragmaInstr::CopyPragma(this_02);
      break;
    case InstrKindJitProfiling:
      this_01 = AsJitProfilingInstr(this);
      opnd = (Opnd *)JitProfilingInstr::CopyJitProfiling(this_01);
    }
  }
  pOVar7 = GetDst(this);
  if ((copyDst) && (pOVar7 != (Opnd *)0x0)) {
    pOVar7 = Opnd::Copy(pOVar7,this->m_func);
    SetDst((Instr *)opnd,pOVar7);
  }
  pOVar7 = GetSrc1(this);
  if (pOVar7 != (Opnd *)0x0) {
    pOVar7 = Opnd::Copy(pOVar7,this->m_func);
    SetSrc1((Instr *)opnd,pOVar7);
    pOVar7 = GetSrc2(this);
    if (pOVar7 != (Opnd *)0x0) {
      pOVar7 = Opnd::Copy(pOVar7,this->m_func);
      SetSrc2((Instr *)opnd,pOVar7);
    }
  }
  *(ushort *)((long)&opnd[3]._vptr_Opnd + 6) =
       *(ushort *)((long)&opnd[3]._vptr_Opnd + 6) & 0xffdf |
       (*(ushort *)&this->field_0x36 >> 5 & 1) << 5;
  bVar2 = Func::DoMaintainByteCodeOffset(this->m_func);
  if (bVar2) {
    uVar5 = GetByteCodeOffset(this);
    SetByteCodeOffset((Instr *)opnd,uVar5);
  }
  *(ushort *)((long)&opnd[3]._vptr_Opnd + 6) =
       *(ushort *)((long)&opnd[3]._vptr_Opnd + 6) & 0xffef |
       (*(ushort *)&this->field_0x36 >> 4 & 1) << 4;
  return (Instr *)opnd;
}

Assistant:

Instr *
Instr::Copy(bool copyDst)
{
    Instr * instrCopy;

    if (this->HasBailOutInfo() || this->HasAuxBailOut())
    {
        instrCopy = BailOutInstr::New(this->m_opcode, this->GetBailOutKind(), this->GetBailOutInfo(), this->m_func);
        instrCopy->SetByteCodeOffset(this->GetByteCodeOffset());
        if (this->HasAuxBailOut())
        {
            instrCopy->hasAuxBailOut = true;
            instrCopy->SetAuxBailOutKind(this->GetAuxBailOutKind());
        }
    }
    else
    {
        switch (this->GetKind())
        {
        case InstrKindInstr:
            instrCopy = Instr::New(this->m_opcode, this->m_func);
            break;

        case InstrKindProfiled:
            instrCopy = this->AsProfiledInstr()->CopyProfiledInstr();
            break;

        case InstrKindJitProfiling:
            instrCopy = this->AsJitProfilingInstr()->CopyJitProfiling();
            break;

        case InstrKindPragma:
            instrCopy = this->AsPragmaInstr()->CopyPragma();
            break;

        default:
            instrCopy = nullptr;
            AnalysisAssertMsg(UNREACHED, "Copy of other instr kinds NYI");
        }
    }

    Opnd * opnd = this->GetDst();
    if (copyDst && opnd)
    {
        instrCopy->SetDst(opnd->Copy(this->m_func));
    }
    opnd = this->GetSrc1();
    if (opnd)
    {
        instrCopy->SetSrc1(opnd->Copy(this->m_func));
        opnd = this->GetSrc2();
        if (opnd)
        {
            instrCopy->SetSrc2(opnd->Copy(this->m_func));
        }
    }

    instrCopy->isInlineeEntryInstr = this->isInlineeEntryInstr;

    if (this->m_func->DoMaintainByteCodeOffset())
    {
        instrCopy->SetByteCodeOffset(this->GetByteCodeOffset());
    }
    instrCopy->usesStackArgumentsObject = this->usesStackArgumentsObject;
    return instrCopy;
}